

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O1

void __thiscall
btHashMap<btHashPtr,_btCollisionObject_*>::insert
          (btHashMap<btHashPtr,_btCollisionObject_*> *this,btHashPtr *key,btCollisionObject **value)

{
  int iVar1;
  int iVar2;
  btCollisionObject **ptr;
  btHashPtr *ptr_00;
  int *piVar3;
  int iVar4;
  int iVar5;
  btCollisionObject **ppbVar6;
  long lVar7;
  btHashPtr *pbVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar5 = (key->field_0).m_hashValues[0];
  iVar10 = (key->field_0).m_hashValues[1];
  iVar12 = (this->m_valueArray).m_capacity;
  iVar4 = findIndex(this,key);
  if (iVar4 == -1) {
    iVar4 = (this->m_valueArray).m_size;
    iVar1 = (this->m_valueArray).m_capacity;
    if (iVar4 == iVar1) {
      iVar14 = 1;
      if (iVar4 != 0) {
        iVar14 = iVar4 * 2;
      }
      if (iVar1 < iVar14) {
        if (iVar14 == 0) {
          ppbVar6 = (btCollisionObject **)0x0;
        }
        else {
          ppbVar6 = (btCollisionObject **)btAlignedAllocInternal((long)iVar14 << 3,0x10);
        }
        lVar7 = (long)(this->m_valueArray).m_size;
        if (0 < lVar7) {
          lVar11 = 0;
          do {
            ppbVar6[lVar11] = (this->m_valueArray).m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar7 != lVar11);
        }
        ptr = (this->m_valueArray).m_data;
        if (ptr != (btCollisionObject **)0x0) {
          if ((this->m_valueArray).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr);
          }
          (this->m_valueArray).m_data = (btCollisionObject **)0x0;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = ppbVar6;
        (this->m_valueArray).m_capacity = iVar14;
      }
    }
    iVar14 = (this->m_valueArray).m_size;
    (this->m_valueArray).m_data[iVar14] = *value;
    (this->m_valueArray).m_size = iVar14 + 1;
    iVar14 = (this->m_keyArray).m_size;
    iVar2 = (this->m_keyArray).m_capacity;
    if (iVar14 == iVar2) {
      iVar13 = 1;
      if (iVar14 != 0) {
        iVar13 = iVar14 * 2;
      }
      if (iVar2 < iVar13) {
        if (iVar13 == 0) {
          pbVar8 = (btHashPtr *)0x0;
        }
        else {
          pbVar8 = (btHashPtr *)btAlignedAllocInternal((long)iVar13 << 3,0x10);
        }
        lVar7 = (long)(this->m_keyArray).m_size;
        if (0 < lVar7) {
          lVar11 = 0;
          do {
            pbVar8[lVar11].field_0 = (this->m_keyArray).m_data[lVar11].field_0;
            lVar11 = lVar11 + 1;
          } while (lVar7 != lVar11);
        }
        ptr_00 = (this->m_keyArray).m_data;
        if (ptr_00 != (btHashPtr *)0x0) {
          if ((this->m_keyArray).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr_00);
          }
          (this->m_keyArray).m_data = (btHashPtr *)0x0;
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pbVar8;
        (this->m_keyArray).m_capacity = iVar13;
      }
    }
    (this->m_keyArray).m_data[(this->m_keyArray).m_size].field_0 = key->field_0;
    piVar3 = &(this->m_keyArray).m_size;
    *piVar3 = *piVar3 + 1;
    if (iVar1 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      iVar5 = (key->field_0).m_hashValues[1] + (key->field_0).m_hashValues[0];
      uVar9 = ~(iVar5 * 0x8000) + iVar5;
      uVar9 = ((int)uVar9 >> 10 ^ uVar9) * 9;
      uVar9 = (int)uVar9 >> 6 ^ uVar9;
      uVar9 = ~(uVar9 << 0xb) + uVar9;
      uVar9 = (int)uVar9 >> 0x10 ^ uVar9;
      iVar12 = (this->m_valueArray).m_capacity;
    }
    else {
      iVar10 = iVar10 + iVar5;
      uVar9 = ~(iVar10 * 0x8000) + iVar10;
      uVar9 = ((int)uVar9 >> 10 ^ uVar9) * 9;
      uVar9 = (int)uVar9 >> 6 ^ uVar9;
      uVar9 = ~(uVar9 << 0xb) + uVar9;
      uVar9 = (int)uVar9 >> 0x10 ^ uVar9;
    }
    uVar9 = iVar12 - 1U & uVar9;
    piVar3 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar4] = piVar3[(int)uVar9];
    piVar3[(int)uVar9] = iVar4;
  }
  else {
    (this->m_valueArray).m_data[iVar4] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}